

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

char * KINGetReturnFlagName(long flag)

{
  char *__s;
  char *name;
  long flag_local;
  
  __s = (char *)malloc(0x18);
  switch(flag) {
  case 0:
    sprintf(__s,"KIN_SUCCESS");
    break;
  case 1:
    sprintf(__s,"KIN_INITIAL_GUESS_OK");
    break;
  case 2:
    sprintf(__s,"KIN_STEP_LT_STPTOL");
    break;
  default:
    sprintf(__s,"NONE");
    break;
  case 99:
    sprintf(__s,"KIN_WARNING");
    break;
  case -0xc:
    sprintf(__s,"KIN_LSOLVE_FAIL");
    break;
  case -0xb:
    sprintf(__s,"KIN_LSETUP_FAIL");
    break;
  case -10:
    sprintf(__s,"KIN_LINIT_FAIL");
    break;
  case -9:
    sprintf(__s,"KIN_LINSOLV_NO_RECOVERY");
    break;
  case -8:
    sprintf(__s,"KIN_LINESEARCH_BCFAIL");
    break;
  case -7:
    sprintf(__s,"KIN_MXNEWT_5X_EXCEEDED");
    break;
  case -6:
    sprintf(__s,"KIN_MAXITER_REACHED");
    break;
  case -5:
    sprintf(__s,"KIN_LINESEARCH_NONCONV");
    break;
  case -4:
    sprintf(__s,"KIN_MEM_FAIL");
    break;
  case -3:
    sprintf(__s,"KIN_NO_MALLOC");
    break;
  case -2:
    sprintf(__s,"KIN_ILL_INPUT");
    break;
  case -1:
    sprintf(__s,"KIN_MEM_NULL");
  }
  return __s;
}

Assistant:

char *KINGetReturnFlagName(long int flag)
{
  char *name;

  name = (char *)malloc(24*sizeof(char));

  switch(flag) {
  case KIN_SUCCESS:
    sprintf(name, "KIN_SUCCESS");
    break;
  case KIN_INITIAL_GUESS_OK:
    sprintf(name, "KIN_INITIAL_GUESS_OK");
    break;
  case KIN_STEP_LT_STPTOL:
    sprintf(name, "KIN_STEP_LT_STPTOL");
    break;
  case KIN_WARNING:
    sprintf(name, "KIN_WARNING");
    break;
  case KIN_MEM_NULL:
    sprintf(name, "KIN_MEM_NULL");
    break;
  case KIN_ILL_INPUT:
    sprintf(name, "KIN_ILL_INPUT");
    break;
  case KIN_NO_MALLOC:
    sprintf(name, "KIN_NO_MALLOC");
    break;
  case KIN_MEM_FAIL:
    sprintf(name, "KIN_MEM_FAIL");
    break;
  case KIN_LINESEARCH_NONCONV:
    sprintf(name, "KIN_LINESEARCH_NONCONV");
    break;
  case KIN_MAXITER_REACHED:
    sprintf(name, "KIN_MAXITER_REACHED");
    break;
  case KIN_MXNEWT_5X_EXCEEDED:
    sprintf(name, "KIN_MXNEWT_5X_EXCEEDED");
    break;
  case KIN_LINESEARCH_BCFAIL:
    sprintf(name, "KIN_LINESEARCH_BCFAIL");
    break;
  case KIN_LINSOLV_NO_RECOVERY:
    sprintf(name, "KIN_LINSOLV_NO_RECOVERY");
    break;
  case KIN_LINIT_FAIL:
    sprintf(name, "KIN_LINIT_FAIL");
    break;
  case KIN_LSETUP_FAIL:
    sprintf(name, "KIN_LSETUP_FAIL");
    break;
  case KIN_LSOLVE_FAIL:
    sprintf(name, "KIN_LSOLVE_FAIL");
    break;
  default:
    sprintf(name, "NONE");
  }

  return(name);
}